

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall HighsSearch::solveDepthFirst(HighsSearch *this,int64_t maxbacktracks)

{
  bool bVar1;
  long in_RSI;
  NodeResult result;
  bool in_stack_000000e7;
  HighsSearch *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffffe8;
  NodeResult in_stack_ffffffffffffffec;
  long local_10;
  
  local_10 = in_RSI;
  while( true ) {
    if (local_10 == 0) {
      return;
    }
    in_stack_ffffffffffffffec =
         dive((HighsSearch *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (in_stack_ffffffffffffffec == kOpen) break;
    local_10 = local_10 + -1;
    bVar1 = backtrack(in_stack_000000e8,in_stack_000000e7);
    if (!bVar1) {
      return;
    }
  }
  return;
}

Assistant:

void HighsSearch::solveDepthFirst(int64_t maxbacktracks) {
  do {
    if (maxbacktracks == 0) break;

    NodeResult result = dive();
    // if a limit was reached the result might be open
    if (result == NodeResult::kOpen) break;

    --maxbacktracks;

  } while (backtrack());
}